

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-id.c++
# Opt level: O1

void __thiscall capnp::compiler::TypeIdGenerator::TypeIdGenerator(TypeIdGenerator *this)

{
  this->finished = false;
  (this->ctx).a = 0x67452301;
  (this->ctx).b = 0xefcdab89;
  (this->ctx).c = 0x98badcfe;
  (this->ctx).d = 0x10325476;
  (this->ctx).lo = 0;
  (this->ctx).hi = 0;
  return;
}

Assistant:

TypeIdGenerator::TypeIdGenerator()
{
  ctx.a = 0x67452301;
  ctx.b = 0xefcdab89;
  ctx.c = 0x98badcfe;
  ctx.d = 0x10325476;

  ctx.lo = 0;
  ctx.hi = 0;
}